

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

argagg * __thiscall argagg::construct_line(argagg *this,string *indent,string *contents)

{
  argagg local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *contents_local;
  string *indent_local;
  
  local_20 = contents;
  contents_local = indent;
  indent_local = (string *)this;
  rstrip(local_60,contents);
  std::operator+(local_40,indent);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  return this;
}

Assistant:

inline
std::string construct_line(const std::string& indent,
                           const std::string& contents)
{
  return indent + rstrip(contents) + "\n";
}